

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

int __thiscall
glslang::HlslParseContext::flattenArray
          (HlslParseContext *this,TVariable *variable,TType *type,TFlattenData *flattenData,
          TString *name,bool linkage,TQualifier *outerQualifier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  char elementNumBuf [20];
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_f0;
  TType dereferencedType;
  
  iVar1 = (*type->_vptr_TType[0x1e])(type);
  if ((char)iVar1 != '\0') {
    iVar1 = (*type->_vptr_TType[0xf])(type);
    TType::TType(&dereferencedType,type,0,false);
    if (name->_M_string_length == 0) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[3])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(name,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     CONCAT44(extraout_var,iVar2));
    }
    iVar2 = (int)((ulong)((long)(flattenData->offsets).
                                super_vector<int,_glslang::pool_allocator<int>_>.
                                super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(flattenData->offsets).
                               super_vector<int,_glslang::pool_allocator<int>_>.
                               super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    local_f0._M_dataplus.super_allocator_type.allocator._0_4_ = 0xffffffff;
    std::vector<int,_glslang::pool_allocator<int>_>::resize
              (&(flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>,
               (long)(iVar2 + iVar1),(value_type_conflict6 *)&local_f0);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (uVar4 = 0; iVar1 != (int)uVar4; uVar4 = uVar4 + 1) {
      snprintf(elementNumBuf,0x13,"[%d]",uVar4 & 0xffffffff);
      std::operator+(&local_f0,name,elementNumBuf);
      iVar3 = (*type->_vptr_TType[0x13])(type);
      iVar3 = addFlattenedMember(this,variable,&dereferencedType,flattenData,&local_f0,linkage,
                                 outerQualifier,(TArraySizes *)CONCAT44(extraout_var_00,iVar3));
      (flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)iVar2 + uVar4] = iVar3;
    }
    return iVar2;
  }
  __assert_fail("type.isSizedArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0x52d,
                "int glslang::HlslParseContext::flattenArray(const TVariable &, const TType &, TFlattenData &, TString, bool, const TQualifier &)"
               );
}

Assistant:

int HlslParseContext::flattenArray(const TVariable& variable, const TType& type,
                                   TFlattenData& flattenData, TString name, bool linkage,
                                   const TQualifier& outerQualifier)
{
    assert(type.isSizedArray());

    const int size = type.getOuterArraySize();
    const TType dereferencedType(type, 0);

    if (name.empty())
        name = variable.getName();

    // Reserve space for this tree level.
    int start = static_cast<int>(flattenData.offsets.size());
    int pos   = start;
    flattenData.offsets.resize(int(pos + size), -1);

    for (int element=0; element < size; ++element) {
        char elementNumBuf[20];  // sufficient for MAXINT
        snprintf(elementNumBuf, sizeof(elementNumBuf)-1, "[%d]", element);
        const int mpos = addFlattenedMember(variable, dereferencedType, flattenData,
                                            name + elementNumBuf, linkage, outerQualifier,
                                            type.getArraySizes());

        flattenData.offsets[pos++] = mpos;
    }

    return start;
}